

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::~SimInfo(SimInfo *this)

{
  this->_vptr_SimInfo = (_func_int **)&PTR__SimInfo_002be400;
  Utils::
  deletePointers<std::map<int,OpenMD::Molecule*,std::less<int>,std::allocator<std::pair<int_const,OpenMD::Molecule*>>>>
            (&this->molecules_);
  if (this->sman_ != (SnapshotManager *)0x0) {
    (*this->sman_->_vptr_SnapshotManager[1])();
  }
  if (this->simParams_ != (Globals *)0x0) {
    (*(this->simParams_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->forceField_ != (ForceField *)0x0) {
    (*this->forceField_->_vptr_ForceField[1])();
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~_Vector_base
            (&(this->IOIndexToIntegrableObject).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>);
  std::__cxx11::string::~string((string *)&this->restFileName_);
  std::__cxx11::string::~string((string *)&this->reportFileName_);
  std::__cxx11::string::~string((string *)&this->statFileName_);
  std::__cxx11::string::~string((string *)&this->dumpFileName_);
  std::__cxx11::string::~string((string *)&this->finalConfigFileName_);
  std::__cxx11::string::~string((string *)&this->rawMetaData_);
  LocalIndexManager::~LocalIndexManager(&this->localIndexMan_);
  PropertyMap::~PropertyMap(&this->properties_);
  PairList::~PairList(&this->oneFourInteractions_);
  PairList::~PairList(&this->oneThreeInteractions_);
  PairList::~PairList(&this->oneTwoInteractions_);
  PairList::~PairList(&this->excludedInteractions_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->massFactors_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->regions_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->identArray_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->globalMolMembership_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->globalGroupMembership_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::
  ~_Vector_base(&(this->moleculeStamps_).
                 super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMD::Molecule_*>,_std::_Select1st<std::pair<const_int,_OpenMD::Molecule_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  ::~_Rb_tree(&(this->molecules_)._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

SimInfo::~SimInfo() {
    Utils::deletePointers(molecules_);

    delete sman_;
    delete simParams_;
    delete forceField_;
  }